

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::streamVariableLengthText(BasicReporter *this,string *prefix,string *text)

{
  long lVar1;
  ostream *poVar2;
  string *in_RSI;
  long in_RDI;
  string trimmed;
  string *in_stack_ffffffffffffff98;
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  trim(in_stack_ffffffffffffff98);
  lVar1 = std::__cxx11::string::find_first_of((char *)local_38,0x1f71b8);
  if (lVar1 == -1) {
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,local_38);
    std::operator<<(poVar2,"]");
  }
  else {
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,"\n[");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n");
    poVar2 = std::operator<<(poVar2,local_38);
    poVar2 = std::operator<<(poVar2,"\n[end of ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,"] <<<<<<<<<<<<<<<<<<<<<<<<\n");
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void streamVariableLengthText( const std::string& prefix, const std::string& text ) {
            std::string trimmed = trim( text );
            if( trimmed.find_first_of( "\r\n" ) == std::string::npos ) {
                m_config.stream() << "[" << prefix << ": " << trimmed << "]";
            }
            else {
                m_config.stream() << "\n[" << prefix << "] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n" << trimmed
                << "\n[end of " << prefix << "] <<<<<<<<<<<<<<<<<<<<<<<<\n";
            }
        }